

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O2

void __thiscall CEPlanet::CEPlanet(CEPlanet *this)

{
  CEBody::CEBody(&this->super_CEBody);
  (this->super_CEBody).super_CESkyCoord._vptr_CESkyCoord = (_func_int **)&PTR__CEPlanet_00165b30;
  std::vector<double,_std::allocator<double>_>::vector(&this->pos_icrs_);
  std::vector<double,_std::allocator<double>_>::vector(&this->vel_icrs_);
  this->E_tol = 1e-06;
  init_members(this);
  return;
}

Assistant:

CEPlanet::CEPlanet() :
    CEBody()
{
    init_members();
}